

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall Assimp::FBX::FBXConverter::ConvertRootNode(FBXConverter *this)

{
  size_type sVar1;
  aiNode *paVar2;
  string unique_name;
  allocator<char> local_79;
  string local_78;
  aiMatrix4x4 local_58;
  
  paVar2 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar2);
  this->out->mRootNode = paVar2;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"RootNode",&local_79);
  GetUniqueName(this,(string *)&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  sVar1 = local_78._M_string_length;
  if (local_78._M_string_length < 0x400) {
    paVar2 = this->out->mRootNode;
    (paVar2->mName).length = (ai_uint32)local_78._M_string_length;
    memcpy((paVar2->mName).data,local_78._M_dataplus._M_p,local_78._M_string_length);
    (paVar2->mName).data[sVar1] = '\0';
  }
  local_58.a1 = 1.0;
  local_58.a2 = 0.0;
  local_58.a3 = 0.0;
  local_58.a4 = 0.0;
  local_58.b1 = 0.0;
  local_58.b2 = 1.0;
  local_58.b3 = 0.0;
  local_58.b4 = 0.0;
  local_58.c1 = 0.0;
  local_58.c2 = 0.0;
  local_58.c3 = 1.0;
  local_58.c4 = 0.0;
  local_58.d1 = 0.0;
  local_58.d2 = 0.0;
  local_58.d3 = 0.0;
  local_58.d4 = 1.0;
  ConvertNodes(this,0,this->out->mRootNode,&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void FBXConverter::ConvertRootNode() {
            out->mRootNode = new aiNode();
            std::string unique_name;
            GetUniqueName("RootNode", unique_name);
            out->mRootNode->mName.Set(unique_name);

            // root has ID 0
            ConvertNodes(0L, *out->mRootNode);
        }